

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_msmblur.h
# Opt level: O2

void __thiscall
embree::avx::BVHBuilderMSMBlur::
BuilderT<embree::NodeRefPtr<8>,_embree::avx::RecalculatePrimRef<embree::Instance>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<8>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,_8>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,_8>::Set,_embree::avx::CreateMSMBlurLeaf<8,_embree::Instance,_embree::InstancePrimitive>,_embree::Scene::BuildProgressMonitorInterface>
::splitFallback(BuilderT<embree::NodeRefPtr<8>,_embree::avx::RecalculatePrimRef<embree::Instance>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<8>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,_8>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,_8>::Set,_embree::avx::CreateMSMBlurLeaf<8,_embree::Instance,_embree::InstancePrimitive>,_embree::Scene::BuildProgressMonitorInterface>
                *this,SetMB *set,SetMB *lset,SetMB *rset)

{
  uint uVar1;
  uint uVar2;
  BBox1f BVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  PrimRefVector pmVar6;
  unsigned_long uVar7;
  ulong uVar8;
  PrimRefMB *pPVar9;
  long lVar10;
  BuilderT<embree::NodeRefPtr<8>,_embree::avx::RecalculatePrimRef<embree::Instance>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<8>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,_8>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,_8>::Set,_embree::avx::CreateMSMBlurLeaf<8,_embree::Instance,_embree::InstancePrimitive>,_embree::Scene::BuildProgressMonitorInterface>
  *pBVar11;
  unsigned_long uVar12;
  ulong uVar13;
  undefined4 uVar14;
  ulong uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_168;
  undefined1 local_158 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_148;
  undefined1 local_138 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_128;
  undefined1 local_118 [16];
  undefined8 local_108;
  undefined1 auStack_100 [16];
  BuilderT<embree::NodeRefPtr<8>,_embree::avx::RecalculatePrimRef<embree::Instance>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<8>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,_8>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,_8>::Set,_embree::avx::CreateMSMBlurLeaf<8,_embree::Instance,_embree::InstancePrimitive>,_embree::Scene::BuildProgressMonitorInterface>
  *pBStack_f0;
  uint local_e8;
  undefined8 local_e4;
  undefined4 local_dc;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_d8;
  undefined1 local_c8 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_b8;
  undefined1 local_a8 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_98;
  undefined1 local_88 [16];
  undefined8 local_78;
  undefined1 auStack_70 [16];
  BuilderT<embree::NodeRefPtr<8>,_embree::avx::RecalculatePrimRef<embree::Instance>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<8>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,_8>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,_8>::Set,_embree::avx::CreateMSMBlurLeaf<8,_embree::Instance,_embree::InstancePrimitive>,_embree::Scene::BuildProgressMonitorInterface>
  *pBStack_60;
  uint local_58;
  undefined8 local_54;
  undefined4 local_4c;
  BBox1f local_48;
  undefined8 uStack_40;
  
  pmVar6 = set->prims;
  uVar7 = (set->super_PrimInfoMB).object_range._begin;
  uVar8 = (set->super_PrimInfoMB).object_range._end;
  uVar15 = uVar7 + uVar8 + 1 >> 1;
  local_98.m128[2] = INFINITY;
  local_98._0_8_ = 0x7f8000007f800000;
  local_98.m128[3] = INFINITY;
  local_88._8_4_ = 0xff800000;
  local_88._0_8_ = 0xff800000ff800000;
  local_88._12_4_ = 0xff800000;
  local_58 = 0;
  local_78 = 0;
  auStack_70 = ZEXT816(0);
  pBStack_60 = (BuilderT<embree::NodeRefPtr<8>,_embree::avx::RecalculatePrimRef<embree::Instance>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<8>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,_8>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,_8>::Set,_embree::avx::CreateMSMBlurLeaf<8,_embree::Instance,_embree::InstancePrimitive>,_embree::Scene::BuildProgressMonitorInterface>
                *)0x0;
  auVar16._8_4_ = 0x3f800000;
  auVar16._0_8_ = 0x3f8000003f800000;
  auVar16._12_4_ = 0x3f800000;
  local_54 = vmovlps_avx(auVar16);
  local_4c = 0;
  lVar10 = uVar7 * 0x50 + 0x44;
  auVar23 = ZEXT1664((undefined1  [16])0x0);
  auVar24 = ZEXT464(0x3f800000);
  auVar16 = ZEXT816(0) << 0x40;
  pBVar11 = (BuilderT<embree::NodeRefPtr<8>,_embree::avx::RecalculatePrimRef<embree::Instance>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<8>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,_8>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,_8>::Set,_embree::avx::CreateMSMBlurLeaf<8,_embree::Instance,_embree::InstancePrimitive>,_embree::Scene::BuildProgressMonitorInterface>
             *)0x0;
  local_a8 = local_88;
  local_b8 = local_98;
  local_c8 = local_88;
  local_d8 = local_98;
  for (uVar12 = uVar7; uVar12 < uVar15; uVar12 = uVar12 + 1) {
    pPVar9 = pmVar6->items;
    auVar19 = *(undefined1 (*) [16])((long)pPVar9 + lVar10 + -0x44);
    auVar4 = *(undefined1 (*) [16])((long)pPVar9 + lVar10 + -0x34);
    auVar5 = *(undefined1 (*) [16])((long)pPVar9 + lVar10 + -0x24);
    auVar21 = *(undefined1 (*) [16])((long)pPVar9 + lVar10 + -0x14);
    auVar17._0_4_ =
         auVar19._0_4_ * 0.5 + auVar5._0_4_ * 0.5 + auVar4._0_4_ * 0.5 + auVar21._0_4_ * 0.5;
    auVar17._4_4_ =
         auVar19._4_4_ * 0.5 + auVar5._4_4_ * 0.5 + auVar4._4_4_ * 0.5 + auVar21._4_4_ * 0.5;
    auVar17._8_4_ =
         auVar19._8_4_ * 0.5 + auVar5._8_4_ * 0.5 + auVar4._8_4_ * 0.5 + auVar21._8_4_ * 0.5;
    auVar17._12_4_ =
         auVar19._12_4_ * 0.5 + auVar5._12_4_ * 0.5 + auVar4._12_4_ * 0.5 + auVar21._12_4_ * 0.5;
    local_d8.m128 = (__m128)vminps_avx(local_d8.m128,auVar19);
    local_c8 = vmaxps_avx(local_c8,auVar4);
    local_98.m128 = (__m128)vminps_avx(local_98.m128,auVar17);
    local_88 = vmaxps_avx(local_88,auVar17);
    local_b8.m128 = (__m128)vminps_avx(local_b8.m128,auVar5);
    local_a8 = vmaxps_avx(local_a8,auVar21);
    auVar18._8_8_ = 1;
    auVar18._0_8_ = 1;
    auVar19 = vinsertps_avx(auVar18,auVar5,0xe8);
    auStack_70 = vpaddq_avx(auVar23._0_16_,auVar19);
    auVar23 = ZEXT1664(auStack_70);
    uVar1 = *(uint *)((long)pPVar9 + lVar10 + -4);
    auVar19 = vminss_avx(auVar24._0_16_,ZEXT416(uVar1));
    auVar24 = ZEXT1664(auVar19);
    uVar14 = vextractps_avx(auVar21,3);
    this = (BuilderT<embree::NodeRefPtr<8>,_embree::avx::RecalculatePrimRef<embree::Instance>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<8>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,_8>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,_8>::Set,_embree::avx::CreateMSMBlurLeaf<8,_embree::Instance,_embree::InstancePrimitive>,_embree::Scene::BuildProgressMonitorInterface>
            *)CONCAT44((int)((ulong)this >> 0x20),uVar14);
    uVar2 = *(uint *)((long)&(pPVar9->lbounds).bounds0.lower.field_0 + lVar10);
    auVar16 = vmaxss_avx(ZEXT416(uVar2),auVar16);
    local_4c = auVar16._0_4_;
    if (pBVar11 < this) {
      pBVar11 = this;
      pBStack_60 = this;
      local_58 = uVar1;
      local_54._0_4_ = uVar2;
    }
    local_54 = CONCAT44(auVar19._0_4_,(uint)local_54);
    lVar10 = lVar10 + 0x50;
  }
  local_128.m128[2] = INFINITY;
  local_128._0_8_ = 0x7f8000007f800000;
  local_128.m128[3] = INFINITY;
  local_118._8_4_ = 0xff800000;
  local_118._0_8_ = 0xff800000ff800000;
  local_118._12_4_ = 0xff800000;
  local_108 = 0;
  auStack_100 = ZEXT816(0);
  pBStack_f0 = (BuilderT<embree::NodeRefPtr<8>,_embree::avx::RecalculatePrimRef<embree::Instance>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<8>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,_8>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,_8>::Set,_embree::avx::CreateMSMBlurLeaf<8,_embree::Instance,_embree::InstancePrimitive>,_embree::Scene::BuildProgressMonitorInterface>
                *)0x0;
  local_e8 = 0;
  auVar19._8_4_ = 0x3f800000;
  auVar19._0_8_ = 0x3f8000003f800000;
  auVar19._12_4_ = 0x3f800000;
  local_e4 = vmovlps_avx(auVar19);
  local_dc = 0;
  lVar10 = uVar15 * 0x50 + 0x44;
  auVar23 = ZEXT1664((undefined1  [16])0x0);
  auVar24 = ZEXT464(0x3f800000);
  auVar16 = ZEXT816(0) << 0x40;
  pBVar11 = (BuilderT<embree::NodeRefPtr<8>,_embree::avx::RecalculatePrimRef<embree::Instance>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<8>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,_8>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,_8>::Set,_embree::avx::CreateMSMBlurLeaf<8,_embree::Instance,_embree::InstancePrimitive>,_embree::Scene::BuildProgressMonitorInterface>
             *)0x0;
  local_138 = local_118;
  local_148 = local_128;
  local_158 = local_118;
  local_168 = local_128;
  for (uVar13 = uVar15; uVar13 < uVar8; uVar13 = uVar13 + 1) {
    pPVar9 = pmVar6->items;
    auVar19 = *(undefined1 (*) [16])((long)pPVar9 + lVar10 + -0x44);
    auVar4 = *(undefined1 (*) [16])((long)pPVar9 + lVar10 + -0x34);
    auVar5 = *(undefined1 (*) [16])((long)pPVar9 + lVar10 + -0x24);
    auVar21 = *(undefined1 (*) [16])((long)pPVar9 + lVar10 + -0x14);
    auVar25._0_4_ =
         auVar19._0_4_ * 0.5 + auVar5._0_4_ * 0.5 + auVar4._0_4_ * 0.5 + auVar21._0_4_ * 0.5;
    auVar25._4_4_ =
         auVar19._4_4_ * 0.5 + auVar5._4_4_ * 0.5 + auVar4._4_4_ * 0.5 + auVar21._4_4_ * 0.5;
    auVar25._8_4_ =
         auVar19._8_4_ * 0.5 + auVar5._8_4_ * 0.5 + auVar4._8_4_ * 0.5 + auVar21._8_4_ * 0.5;
    auVar25._12_4_ =
         auVar19._12_4_ * 0.5 + auVar5._12_4_ * 0.5 + auVar4._12_4_ * 0.5 + auVar21._12_4_ * 0.5;
    local_168.m128 = (__m128)vminps_avx(local_168.m128,auVar19);
    local_158 = vmaxps_avx(local_158,auVar4);
    local_128.m128 = (__m128)vminps_avx(local_128.m128,auVar25);
    local_118 = vmaxps_avx(local_118,auVar25);
    local_148.m128 = (__m128)vminps_avx(local_148.m128,auVar5);
    local_138 = vmaxps_avx(local_138,auVar21);
    auVar20._8_8_ = 1;
    auVar20._0_8_ = 1;
    auVar19 = vinsertps_avx(auVar20,auVar5,0xe8);
    auStack_100 = vpaddq_avx(auVar23._0_16_,auVar19);
    auVar23 = ZEXT1664(auStack_100);
    uVar1 = *(uint *)((long)pPVar9 + lVar10 + -4);
    auVar19 = vminss_avx(auVar24._0_16_,ZEXT416(uVar1));
    auVar24 = ZEXT1664(auVar19);
    uVar14 = vextractps_avx(auVar21,3);
    this = (BuilderT<embree::NodeRefPtr<8>,_embree::avx::RecalculatePrimRef<embree::Instance>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<8>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,_8>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,_8>::Set,_embree::avx::CreateMSMBlurLeaf<8,_embree::Instance,_embree::InstancePrimitive>,_embree::Scene::BuildProgressMonitorInterface>
            *)CONCAT44((int)((ulong)this >> 0x20),uVar14);
    uVar2 = *(uint *)((long)&(pPVar9->lbounds).bounds0.lower.field_0 + lVar10);
    auVar16 = vmaxss_avx(ZEXT416(uVar2),auVar16);
    local_dc = auVar16._0_4_;
    if (pBVar11 < this) {
      pBVar11 = this;
      pBStack_f0 = this;
      local_e8 = uVar1;
      local_e4._0_4_ = uVar2;
    }
    local_e4 = CONCAT44(auVar19._0_4_,(uint)local_e4);
    lVar10 = lVar10 + 0x50;
  }
  local_48 = (set->super_PrimInfoMB).time_range;
  uStack_40 = 0;
  PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::PrimInfoMBT
            (&lset->super_PrimInfoMB,
             (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&local_d8.field_1);
  lset->prims = pmVar6;
  (lset->super_PrimInfoMB).object_range._begin = uVar7;
  (lset->super_PrimInfoMB).object_range._end = uVar15;
  auVar21._8_8_ = 0;
  auVar21._0_4_ = (lset->super_PrimInfoMB).time_range.lower;
  auVar21._4_4_ = (lset->super_PrimInfoMB).time_range.upper;
  auVar5._8_8_ = uStack_40;
  auVar5._0_4_ = local_48.lower;
  auVar5._4_4_ = local_48.upper;
  auVar16 = vcmpps_avx(auVar21,auVar5,1);
  auVar19 = vinsertps_avx(auVar5,auVar21,0x50);
  auVar4 = vinsertps_avx(auVar21,auVar5,0x50);
  auVar16 = vblendvps_avx(auVar4,auVar19,auVar16);
  BVar3 = (BBox1f)vmovlps_avx(auVar16);
  (lset->super_PrimInfoMB).time_range = BVar3;
  pmVar6 = set->prims;
  PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::PrimInfoMBT
            (&rset->super_PrimInfoMB,
             (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&local_168.field_1);
  rset->prims = pmVar6;
  (rset->super_PrimInfoMB).object_range._begin = uVar15;
  (rset->super_PrimInfoMB).object_range._end = uVar8;
  auVar22._8_8_ = 0;
  auVar22._0_4_ = (rset->super_PrimInfoMB).time_range.lower;
  auVar22._4_4_ = (rset->super_PrimInfoMB).time_range.upper;
  auVar4._8_8_ = 0;
  auVar4._0_4_ = (set->super_PrimInfoMB).time_range.lower;
  auVar4._4_4_ = (set->super_PrimInfoMB).time_range.upper;
  auVar16 = vcmpps_avx(auVar22,auVar4,1);
  auVar19 = vinsertps_avx(auVar4,auVar22,0x50);
  auVar4 = vinsertps_avx(auVar22,auVar4,0x50);
  auVar16 = vblendvps_avx(auVar4,auVar19,auVar16);
  BVar3 = (BBox1f)vmovlps_avx(auVar16);
  (rset->super_PrimInfoMB).time_range = BVar3;
  return;
}

Assistant:

void splitFallback(const SetMB& set, SetMB& lset, SetMB& rset)
          {
            mvector<PrimRefMB>& prims = *set.prims;

            const size_t begin = set.begin();
            const size_t end   = set.end();
            const size_t center = (begin + end + 1) / 2;

            PrimInfoMB linfo = empty;
            for (size_t i=begin; i<center; i++)
              linfo.add_primref(prims[i]);

            PrimInfoMB rinfo = empty;
            for (size_t i=center; i<end; i++)
              rinfo.add_primref(prims[i]);

            new (&lset) SetMB(linfo,set.prims,range<size_t>(begin,center),set.time_range);
            new (&rset) SetMB(rinfo,set.prims,range<size_t>(center,end  ),set.time_range);
          }